

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O2

void * rw::textureClose(void *object,int32 offset,int32 size)

{
  undefined8 *puVar1;
  ulong uVar2;
  undefined8 *puVar3;
  long lVar4;
  
  uVar2 = (ulong)(int)textureModuleOffset;
  puVar3 = *(undefined8 **)(engine + 0x20 + uVar2);
  while (lVar4 = (long)(int)uVar2, puVar3 != (undefined8 *)(engine + lVar4 + 0x20)) {
    puVar1 = (undefined8 *)*puVar3;
    TexDictionary::destroy((TexDictionary *)(puVar3 + -4));
    uVar2 = (ulong)textureModuleOffset;
    puVar3 = puVar1;
  }
  *(undefined8 *)(engine + lVar4) = 0;
  *(undefined8 *)(engine + 8 + lVar4) = 0;
  puVar3 = *(undefined8 **)(engine + 0x30 + lVar4);
  while (puVar3 != (undefined8 *)((int)uVar2 + engine + 0x30)) {
    puVar1 = (undefined8 *)*puVar3;
    printf("Tex still allocated: %d %s %s\n",(ulong)*(uint *)((long)puVar3 + -4),puVar3 + -9,
           puVar3 + -5);
    Texture::destroy((Texture *)(puVar3 + -0xd));
    uVar2 = (ulong)textureModuleOffset;
    puVar3 = puVar1;
  }
  return object;
}

Assistant:

static void*
textureClose(void *object, int32 offset, int32 size)
{
	FORLIST(lnk, TEXTUREGLOBAL(texDicts))
		TexDictionary::fromLink(lnk)->destroy();
	TEXTUREGLOBAL(initialTexDict) = nil;
	TEXTUREGLOBAL(currentTexDict) = nil;

	FORLIST(lnk, TEXTUREGLOBAL(textures)){
		Texture *tex = LLLinkGetData(lnk, Texture, inGlobalList);
		printf("Tex still allocated: %d %s %s\n", tex->refCount, tex->name, tex->mask);
		assert(tex->dict == nil);
		tex->destroy();
	}
	return object;
}